

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualize.hpp
# Opt level: O2

void visualize::drawListElement<double>
               (double elem,uint index,uint total,uint highest,Renderer *render,Color *color)

{
  uint y1;
  uint uVar1;
  int iVar2;
  int x1;
  int x2;
  
  uVar1 = SDL2pp::Renderer::GetOutputWidth(render);
  iVar2 = SDL2pp::Renderer::GetOutputHeight(render);
  y1 = iVar2 - 5;
  x1 = index * (uVar1 / total);
  SDL2pp::Renderer::SetDrawColor(render,color);
  x2 = uVar1 / total + x1;
  iVar2 = (iVar2 - (int)((double)((ulong)y1 / (ulong)highest) * elem)) + -5;
  SDL2pp::Renderer::FillRect(render,x1,y1,x2,iVar2);
  SDL2pp::Renderer::SetDrawColor(render,0xff,0xff,0xff,0xff);
  SDL2pp::Renderer::DrawRect(render,x1,y1,x2,iVar2);
  return;
}

Assistant:

void drawListElement(T elem, unsigned index, unsigned total, unsigned highest , SDL2pp::Renderer &render, const SDL2pp::Color &color = {6, 202, 72}) {
        static_assert(std::is_arithmetic<T>::value,"Only arithmetic types are allowed to define graphs");
        int s_width = render.GetOutputWidth();
        int s_height = render.GetOutputHeight() - 5 ;
        int elem_width = s_width / total;
        int elem_height = ((s_height / highest) * elem) ;
        int x = index * elem_width;
        render.SetDrawColor(color);
        render.FillRect(x, s_height, x + elem_width, s_height - elem_height); // FILL COLOR
        render.SetDrawColor(255, 255, 255);
        render.DrawRect(x, s_height, x + elem_width, s_height - elem_height); // DRAW BORDER
    }